

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

bool __thiscall deqp::gls::DrawTestSpec::AttributeSpec::isBufferStrideAligned(AttributeSpec *this)

{
  int iVar1;
  
  if (this->storage == STORAGE_BUFFER) {
    iVar1 = 4;
    if ((this->inputType & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
      iVar1 = inputTypeSize::size[(int)this->inputType];
    }
    if (this->stride % iVar1 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DrawTestSpec::AttributeSpec::isBufferStrideAligned (void) const
{
	const bool inputTypePacked = inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10;

	// Buffer alignment, offset is a multiple of underlying data type size?
	if (storage == STORAGE_BUFFER)
	{
		int dataTypeSize = gls::DrawTestSpec::inputTypeSize(inputType);
		if (inputTypePacked)
			dataTypeSize = 4;

		if (stride % dataTypeSize != 0)
			return false;
	}

	return true;
}